

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessage<unsigned_long,unsigned_long,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,unsigned_long params,
          unsigned_long params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  params_1_00._M_p = (pointer)0x0;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,*(long *)params_1,*(long *)(params_1 + 8) + *(long *)params_1);
  ConstructMessageRecursive<unsigned_long,unsigned_long,std::__cxx11::string>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff98,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,params,(unsigned_long)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1_00._M_p);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff98);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}